

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteString.cpp
# Opt level: O0

ByteString * __thiscall ByteString::operator+=(ByteString *this,ByteString *append)

{
  size_type __new_size;
  size_type __n;
  reference __dest;
  const_reference __src;
  vector<unsigned_char,_SecureAllocator<unsigned_char>_> *in_RSI;
  ByteString *in_RDI;
  size_t newLen;
  size_t toAdd;
  size_t curLen;
  
  __new_size = std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::size
                         (&in_RDI->byteString);
  __n = std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_SecureAllocator<unsigned_char>_> *)
                   &(in_RSI->super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data);
  std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::resize(in_RSI,__new_size);
  if (__n != 0) {
    __dest = std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::operator[]
                       (&in_RDI->byteString,__new_size);
    __src = std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::operator[]
                      ((vector<unsigned_char,_SecureAllocator<unsigned_char>_> *)
                       &(in_RSI->super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>)
                        ._M_impl.super__Vector_impl_data,0);
    memcpy(__dest,__src,__n);
  }
  return in_RDI;
}

Assistant:

ByteString& ByteString::operator+=(const ByteString& append)
{
	size_t curLen = byteString.size();
	size_t toAdd = append.byteString.size();
	size_t newLen = curLen + toAdd;

	byteString.resize(newLen);

	if (toAdd > 0)
		memcpy(&byteString[curLen], &append.byteString[0], toAdd);

	return *this;
}